

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownConstantFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,column_t expr_id,
          vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *info_list)

{
  string *psVar1;
  PhysicalType PVar2;
  ExpressionType EVar3;
  LogicalTypeId comparison_type_p;
  ulong uVar4;
  Value *pVVar5;
  bool bVar6;
  int iVar7;
  reference pvVar8;
  _Base_ptr p_Var9;
  BoundFunctionExpression *pBVar10;
  const_reference this_00;
  Expression *this_01;
  BoundColumnRefExpression *pBVar11;
  const_reference pvVar12;
  _Base_ptr p_Var13;
  ConstantFilter *this_02;
  _Base_ptr p_Var14;
  FilterPushdownResult FVar15;
  Value *other;
  pointer *__ptr;
  ColumnIndex column_index;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_c8;
  long *local_c0;
  map<unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
  *local_b8;
  const_iterator local_b0;
  vector<duckdb::ColumnIndex,_true> *local_a8;
  reference local_a0;
  TableFilterSet *local_98;
  ColumnIndex local_90;
  Value local_70;
  
  if ((info_list->
      super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ).
      super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (info_list->
      super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ).
      super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FVar15 = NO_PUSHDOWN;
  }
  else {
    local_a8 = column_ids;
    local_98 = table_filters;
    pvVar8 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::operator[]
                       (info_list,0);
    bVar6 = TypeIsNumeric((pvVar8->constant).type_.physical_type_);
    if ((((bVar6) || (PVar2 = (pvVar8->constant).type_.physical_type_, PVar2 == VARCHAR)) ||
        (FVar15 = NO_PUSHDOWN, PVar2 == BOOL)) &&
       (FVar15 = NO_PUSHDOWN, (byte)(pvVar8->comparison_type - COMPARE_BOUNDARY_START) < 6)) {
      p_Var14 = (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var13 = &(this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var9 = p_Var13;
      if (p_Var14 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var14 + 1) >= expr_id) {
            p_Var9 = p_Var14;
          }
          p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < expr_id];
        } while (p_Var14 != (_Base_ptr)0x0);
        if ((p_Var9 != p_Var13) && (*(ulong *)(p_Var9 + 1) <= expr_id)) {
          p_Var13 = p_Var9;
        }
      }
      if ((long)p_Var13[1]._M_left - (long)p_Var13[1]._M_parent == 8) {
        local_b8 = &this->equivalence_map;
        local_a0 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                             ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                              &p_Var13[1]._M_parent,0);
        uVar4 = *(ulong *)(p_Var13 + 1);
        local_90.index = 0xffffffffffffffff;
        local_90.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_90.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_90.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_01 = local_a0->_M_data;
        local_b0._M_node = p_Var13;
        while (EVar3 = (this_01->super_BaseExpression).type, EVar3 == BOUND_FUNCTION) {
          pBVar10 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                              (&this_01->super_BaseExpression);
          psVar1 = &(pBVar10->function).super_BaseScalarFunction.super_SimpleFunction.super_Function
                    .name;
          iVar7 = ::std::__cxx11::string::compare((char *)psVar1);
          if ((iVar7 != 0) &&
             (iVar7 = ::std::__cxx11::string::compare((char *)psVar1), FVar15 = NO_PUSHDOWN,
             iVar7 != 0)) goto LAB_0068e377;
          this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&pBVar10->children,0);
          this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(this_00);
        }
        FVar15 = NO_PUSHDOWN;
        if (EVar3 == BOUND_COLUMN_REF) {
          pBVar11 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                              (&this_01->super_BaseExpression);
          pvVar12 = vector<duckdb::ColumnIndex,_true>::operator[]
                              (local_a8,(pBVar11->binding).column_index);
          local_90.index = pvVar12->index;
          ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::operator=
                    (&local_90.child_indexes.
                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,
                     &(pvVar12->child_indexes).
                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
          p_Var13 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var14 = p_Var9;
          if (p_Var13 != (_Base_ptr)0x0) {
            do {
              if (*(ulong *)(p_Var13 + 1) >= uVar4) {
                p_Var14 = p_Var13;
              }
              p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar4];
            } while (p_Var13 != (_Base_ptr)0x0);
            if ((p_Var14 != p_Var9) && (*(ulong *)(p_Var14 + 1) <= uVar4)) {
              p_Var9 = p_Var14;
            }
          }
          other = (Value *)p_Var9[1]._M_parent;
          pVVar5 = (Value *)p_Var9[1]._M_left;
          if (other != pVVar5) {
            do {
              this_02 = (ConstantFilter *)operator_new(0x50);
              comparison_type_p = other[1].type_.id_;
              Value::Value(&local_70,other);
              ConstantFilter::ConstantFilter(this_02,comparison_type_p,&local_70);
              Value::~Value(&local_70);
              local_c8._M_head_impl = (TableFilter *)this_02;
              PushDownFilterIntoExpr
                        ((duckdb *)&local_c0,local_a0->_M_data,
                         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_c8);
              TableFilterSet::PushFilter
                        (local_98,&local_90,
                         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_c0);
              if (local_c0 != (long *)0x0) {
                (**(code **)(*local_c0 + 8))();
              }
              local_c0 = (long *)0x0;
              if ((ConstantFilter *)local_c8._M_head_impl != (ConstantFilter *)0x0) {
                (*((TableFilter *)&(local_c8._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1]
                )();
              }
              local_c8._M_head_impl = (TableFilter *)0x0;
              other = (Value *)&other[1].type_.type_info_;
            } while (other != pVVar5);
          }
          ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
          ::_M_erase_aux(&local_b8->_M_t,local_b0);
          FVar15 = PUSHED_DOWN_FULLY;
        }
LAB_0068e377:
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  (&local_90.child_indexes.
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
      }
    }
  }
  return FVar15;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownConstantFilter(TableFilterSet &table_filters,
                                                               const vector<ColumnIndex> &column_ids, column_t expr_id,
                                                               vector<ExpressionValueInformation> &info_list) {
	if (info_list.empty()) {
		// no constants - already removed
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &constant_info = info_list[0];
	// check if the type is supported
	if (!TypeSupportsConstantFilter(constant_info.constant.type())) {
		// not supported
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	if (!SupportedFilterComparison(constant_info.comparison_type)) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	//! Here we check if these filters are column references
	auto filter_exp = equivalence_map.find(expr_id);
	if (filter_exp->second.size() != 1) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}

	auto &expr = filter_exp->second[0];
	auto equiv_set = filter_exp->first;

	// Try to get the column index, either from bound column ref, or a column ref nested inside of a
	// struct_extract call
	ColumnIndex column_index;
	if (!TryGetBoundColumnIndex(column_ids, expr, column_index)) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}

	auto &constant_list = constant_values.find(equiv_set)->second;
	for (auto &constant_cmp : constant_list) {
		auto constant_filter = make_uniq<ConstantFilter>(constant_cmp.comparison_type, constant_cmp.constant);
		table_filters.PushFilter(column_index, PushDownFilterIntoExpr(expr, std::move(constant_filter)));
	}
	equivalence_map.erase(filter_exp);
	return FilterPushdownResult::PUSHED_DOWN_FULLY;
}